

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

Element * __thiscall
Rml::Context::GetElementAtPoint
          (Context *this,Vector2f point,Element *ignore_element,Element *element)

{
  ElementDocument *this_00;
  bool bVar1;
  PointerEvents PVar2;
  bool bVar3;
  pointer pEVar4;
  Vector2f VVar5;
  size_type sVar6;
  reference ppEVar7;
  ElementDocument *this_01;
  ComputedValues *this_02;
  Vector2<int> point_00;
  byte local_b1;
  undefined1 local_90 [8];
  Rectanglei clip_region;
  bool local_72;
  bool within_element;
  bool projection_result;
  Element *child_element;
  ElementDocument *child_document;
  Element *element_hierarchy;
  Element *stacking_child;
  ElementDocument *pEStack_40;
  int i;
  ElementDocument *focus_document;
  Vector2f VStack_30;
  bool is_modal;
  Element *element_local;
  Element *ignore_element_local;
  Context *this_local;
  Vector2f point_local;
  
  VStack_30 = (Vector2f)element;
  this_local = (Context *)point;
  if (element == (Element *)0x0) {
    pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&this->root);
    if (ignore_element == pEVar4) {
      return (Element *)0x0;
    }
    VStack_30 = (Vector2f)
                ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&this->root);
  }
  bVar3 = false;
  pEStack_40 = (ElementDocument *)0x0;
  VVar5 = (Vector2f)::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&this->root);
  if ((((VStack_30 == VVar5) && (this->focus != (Element *)0x0)) &&
      (pEStack_40 = Element::GetOwnerDocument(this->focus), pEStack_40 != (ElementDocument *)0x0))
     && (bVar1 = ElementDocument::IsModal(pEStack_40), bVar1)) {
    bVar3 = true;
  }
  if ((*(bool *)((long)VStack_30 + 0x10) & 1U) == 0) {
LAB_004cd754:
    this_02 = Element::GetComputedValues((Element *)VStack_30);
    PVar2 = Style::ComputedValues::pointer_events(this_02);
    if (PVar2 == None) {
      point_local.x = 0.0;
      point_local.y = 0.0;
    }
    else {
      bVar3 = Element::Project((Element *)VStack_30,(Vector2f *)&this_local);
      local_b1 = 0;
      if (bVar3) {
        clip_region.p1 = (Vector2Type)this_local;
        local_b1 = (**(code **)(*(long *)VStack_30 + 0x38))(this_local);
      }
      local_72 = (bool)(local_b1 & 1);
      if (local_72 != false) {
        Rectangle<int>::Rectangle((Rectangle<int> *)local_90);
        bVar3 = ElementUtilities::GetClippingRegion
                          ((Element *)VStack_30,(Rectanglei *)local_90,(ClipMaskGeometryList *)0x0,
                           false);
        if (bVar3) {
          point_00 = Vector2::operator_cast_to_Vector2((Vector2 *)&this_local);
          local_72 = Rectangle<int>::Contains((Rectangle<int> *)local_90,point_00);
        }
      }
      if (local_72 == false) {
        point_local.x = 0.0;
        point_local.y = 0.0;
      }
      else {
        point_local = VStack_30;
      }
    }
  }
  else {
    if ((*(bool *)((long)VStack_30 + 0x12) & 1U) != 0) {
      Element::BuildLocalStackingContext((Element *)VStack_30);
    }
    sVar6 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::size
                      ((ElementList *)((long)VStack_30 + 0x148));
    stacking_child._4_4_ = (int)sVar6;
LAB_004cd673:
    do {
      stacking_child._4_4_ = stacking_child._4_4_ + -1;
      if (stacking_child._4_4_ < 0) goto LAB_004cd754;
      ppEVar7 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::operator[]
                          ((ElementList *)((long)VStack_30 + 0x148),(long)stacking_child._4_4_);
      this_00 = (ElementDocument *)*ppEVar7;
      child_document = this_00;
      if (ignore_element != (Element *)0x0) {
        for (; (child_document != (ElementDocument *)0x0 &&
               (child_document != (ElementDocument *)ignore_element));
            child_document =
                 (ElementDocument *)Element::GetParentNode(&child_document->super_Element)) {
        }
        if (child_document != (ElementDocument *)0x0) goto LAB_004cd673;
      }
    } while (((bVar3) &&
             ((this_01 = Element::GetOwnerDocument((Element *)this_00),
              this_01 == (ElementDocument *)0x0 ||
              ((this_01 != pEStack_40 &&
               (bVar1 = ElementDocument::IsFocusableFromModal(this_01), !bVar1)))))) ||
            (point_local = (Vector2f)
                           GetElementAtPoint(this,(Vector2f)this_local,ignore_element,
                                             (Element *)this_00), point_local == (Vector2f)0x0));
  }
  return (Element *)point_local;
}

Assistant:

Element* Context::GetElementAtPoint(Vector2f point, const Element* ignore_element, Element* element) const
{
	if (!element)
	{
		if (ignore_element == root.get())
			return nullptr;

		element = root.get();
	}

	bool is_modal = false;
	ElementDocument* focus_document = nullptr;

	// If we have modal focus, only check down documents that can receive focus from modals.
	if (element == root.get() && focus)
	{
		focus_document = focus->GetOwnerDocument();
		if (focus_document && focus_document->IsModal())
			is_modal = true;
	}

	// Check any elements within our stacking context. We want to return the lowest-down element
	// that is under the cursor.
	if (element->local_stacking_context)
	{
		if (element->stacking_context_dirty)
			element->BuildLocalStackingContext();

		for (int i = (int)element->stacking_context.size() - 1; i >= 0; --i)
		{
			Element* stacking_child = element->stacking_context[i];
			if (ignore_element)
			{
				// Check if the element is a descendant of the element we're ignoring.
				Element* element_hierarchy = stacking_child;
				while (element_hierarchy)
				{
					if (element_hierarchy == ignore_element)
						break;

					element_hierarchy = element_hierarchy->GetParentNode();
				}

				if (element_hierarchy)
					continue;
			}

			if (is_modal)
			{
				ElementDocument* child_document = stacking_child->GetOwnerDocument();
				if (!child_document || !(child_document == focus_document || child_document->IsFocusableFromModal()))
					continue;
			}

			Element* child_element = GetElementAtPoint(point, ignore_element, stacking_child);
			if (child_element)
				return child_element;
		}
	}

	// Ignore elements whose pointer events are disabled.
	if (element->GetComputedValues().pointer_events() == Style::PointerEvents::None)
		return nullptr;

	// Projection may fail if we have a singular transformation matrix.
	bool projection_result = element->Project(point);

	// Check if the point is actually within this element.
	bool within_element = (projection_result && element->IsPointWithinElement(point));
	if (within_element)
	{
		// The element may have been clipped out of view if it overflows an ancestor, so check its clipping region.
		Rectanglei clip_region;
		if (ElementUtilities::GetClippingRegion(element, clip_region))
			within_element = clip_region.Contains(Vector2i(point));
	}

	if (within_element)
		return element;

	return nullptr;
}